

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeType
          (BinaryReaderObjdumpDisassemble *this,Type type)

{
  Enum EVar1;
  char *pcVar2;
  string local_40;
  BinaryReaderObjdumpDisassemble *local_20;
  BinaryReaderObjdumpDisassemble *this_local;
  Type type_local;
  
  local_20 = this;
  unique0x10000145 = type;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)&type_local,Ok);
  }
  else {
    EVar1 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
    if (EVar1 == SelectT) {
      Type::GetName_abi_cxx11_(&local_40,(Type *)((long)&this_local + 4));
      pcVar2 = (char *)std::__cxx11::string::c_str();
      LogOpcode(this,pcVar2);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      pcVar2 = Type::GetRefKindName((Type *)((long)&this_local + 4));
      LogOpcode(this,pcVar2);
    }
    Result::Result((Result *)&type_local,Ok);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeType(Type type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  if (current_opcode == Opcode::SelectT) {
    LogOpcode(type.GetName().c_str());
  } else {
    LogOpcode(type.GetRefKindName());
  }
  return Result::Ok;
}